

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ratio.cpp
# Opt level: O0

string * __thiscall Ratio::toStringCombType_abi_cxx11_(Ratio *this)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  long in_RSI;
  string *in_RDI;
  size_t i_1;
  size_t i;
  ostringstream ss;
  ulong local_1a8;
  ulong local_1a0;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"{");
  local_1a0 = 0;
  while( true ) {
    sVar2 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x10));
    if (sVar2 <= local_1a0) break;
    pvVar3 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x10),
                        local_1a0);
    iVar1 = PhyloTreeEdge::getOriginalID(pvVar3);
    std::ostream::operator<<(local_188,iVar1);
    sVar2 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x10));
    if (local_1a0 < sVar2 - 1) {
      std::operator<<((ostream *)local_188,",");
    }
    local_1a0 = local_1a0 + 1;
  }
  std::operator<<((ostream *)local_188,"}/{");
  local_1a8 = 0;
  while( true ) {
    sVar2 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x28));
    if (sVar2 <= local_1a8) break;
    pvVar3 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                       ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x28),
                        local_1a8);
    iVar1 = PhyloTreeEdge::getOriginalID(pvVar3);
    std::ostream::operator<<(local_188,iVar1);
    sVar2 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)(in_RSI + 0x28));
    if (local_1a8 < sVar2 - 1) {
      std::operator<<((ostream *)local_188,",");
    }
    local_1a8 = local_1a8 + 1;
  }
  std::operator<<((ostream *)local_188,"}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

string Ratio::toStringCombType() {
    ostringstream ss;
    ss << "{";

    for (size_t i = 0; i < eEdges.size(); i++) {
        ss << eEdges[i].getOriginalID();
        if (i < eEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}/{";

    for (size_t i = 0; i < fEdges.size(); i++) {
        ss << fEdges[i].getOriginalID();
        if (i < fEdges.size() - 1) {
            ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}